

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O3

PHashSHA2_512 * pp_crypto_hash_sha2_512_new_internal(pboolean is384)

{
  PHashSHA2_512 *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  
  pPVar1 = (PHashSHA2_512 *)p_malloc0(0xd8);
  if (pPVar1 != (PHashSHA2_512 *)0x0) {
    pPVar1->is384 = is384;
    (pPVar1->buf).buf_w[0] = 0;
    (pPVar1->buf).buf_w[1] = 0;
    (pPVar1->buf).buf_w[2] = 0;
    (pPVar1->buf).buf_w[3] = 0;
    (pPVar1->buf).buf_w[4] = 0;
    (pPVar1->buf).buf_w[5] = 0;
    (pPVar1->buf).buf_w[6] = 0;
    (pPVar1->buf).buf_w[7] = 0;
    (pPVar1->buf).buf_w[8] = 0;
    (pPVar1->buf).buf_w[9] = 0;
    (pPVar1->buf).buf_w[10] = 0;
    (pPVar1->buf).buf_w[0xb] = 0;
    (pPVar1->buf).buf_w[0xc] = 0;
    (pPVar1->buf).buf_w[0xd] = 0;
    (pPVar1->buf).buf_w[0xe] = 0;
    (pPVar1->buf).buf_w[0xf] = 0;
    pPVar1->len_high = 0;
    pPVar1->len_low = 0;
    if (is384 == 0) {
      uVar2 = 0xfb41bd6b;
      uVar3 = 0x1f83d9ab;
      uVar4 = 0x137e2179;
      uVar5 = 0x5be0cd19;
      uVar6 = 0xade682d1;
      uVar7 = 0x510e527f;
      uVar8 = 0x2b3e6c1f;
      uVar9 = 0x9b05688c;
      uVar10 = 0xfe94f82b;
      uVar11 = 0x3c6ef372;
      uVar12 = 0x5f1d36f1;
      uVar13 = 0xa54ff53a;
      uVar14 = 0xf3bcc908;
      uVar15 = 0x6a09e667;
      uVar16 = 0x84caa73b;
      uVar17 = 0xbb67ae85;
    }
    else {
      uVar2 = 0x64f98fa7;
      uVar3 = 0xdb0c2e0d;
      uVar4 = 0xbefa4fa4;
      uVar5 = 0x47b5481d;
      uVar6 = 0xffc00b31;
      uVar7 = 0x67332667;
      uVar8 = 0x68581511;
      uVar9 = 0x8eb44a87;
      uVar10 = 0x3070dd17;
      uVar11 = 0x9159015a;
      uVar12 = 0xf70e5939;
      uVar13 = 0x152fecd8;
      uVar14 = 0xc1059ed8;
      uVar15 = 0xcbbb9d5d;
      uVar16 = 0x367cd507;
      uVar17 = 0x629a292a;
    }
    *(undefined4 *)pPVar1->hash = uVar14;
    *(undefined4 *)((long)pPVar1->hash + 4) = uVar15;
    *(undefined4 *)(pPVar1->hash + 1) = uVar16;
    *(undefined4 *)((long)pPVar1->hash + 0xc) = uVar17;
    *(undefined4 *)(pPVar1->hash + 2) = uVar10;
    *(undefined4 *)((long)pPVar1->hash + 0x14) = uVar11;
    *(undefined4 *)(pPVar1->hash + 3) = uVar12;
    *(undefined4 *)((long)pPVar1->hash + 0x1c) = uVar13;
    *(undefined4 *)(pPVar1->hash + 4) = uVar6;
    *(undefined4 *)((long)pPVar1->hash + 0x24) = uVar7;
    *(undefined4 *)(pPVar1->hash + 5) = uVar8;
    *(undefined4 *)((long)pPVar1->hash + 0x2c) = uVar9;
    *(undefined4 *)(pPVar1->hash + 6) = uVar2;
    *(undefined4 *)((long)pPVar1->hash + 0x34) = uVar3;
    *(undefined4 *)(pPVar1->hash + 7) = uVar4;
    *(undefined4 *)((long)pPVar1->hash + 0x3c) = uVar5;
  }
  return pPVar1;
}

Assistant:

static PHashSHA2_512 *
pp_crypto_hash_sha2_512_new_internal (pboolean is384)
{
	PHashSHA2_512 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_512))) == NULL))
		return NULL;

	ret->is384 = is384;

	p_crypto_hash_sha2_512_reset (ret);

	return ret;
}